

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_text.cpp
# Opt level: O3

void breakit(FBrokenLines *line,FFont *font,BYTE *start,BYTE *stop,FString *linecolor)

{
  int iVar1;
  FString FStack_38;
  
  if (*(int *)(linecolor->Chars + -0xc) != 0) {
    FString::FString(&FStack_38,'\x1c');
    FString::operator=(&line->Text,&FStack_38);
    FString::~FString(&FStack_38);
    FString::operator+=(&line->Text,linecolor);
  }
  FString::AppendCStrPart(&line->Text,(char *)start,(long)stop - (long)start);
  iVar1 = FFont::StringWidth(font,(BYTE *)(line->Text).Chars);
  line->Width = iVar1;
  return;
}

Assistant:

static void breakit (FBrokenLines *line, FFont *font, const BYTE *start, const BYTE *stop, FString &linecolor)
{
	if (!linecolor.IsEmpty())
	{
		line->Text = TEXTCOLOR_ESCAPE;
		line->Text += linecolor;
	}
	line->Text.AppendCStrPart ((const char *)start, stop - start);
	line->Width = font->StringWidth (line->Text);
}